

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Box.H
# Opt level: O0

Box * __thiscall amrex::Box::operator&=(Box *this,Box *rhs)

{
  IntVect *pIVar1;
  int local_64;
  int local_60;
  int local_5c;
  int local_4c;
  int local_48;
  int local_44;
  Box *rhs_local;
  Box *this_local;
  
  if ((rhs->smallend).vect[0] < (this->smallend).vect[0]) {
    local_44 = (this->smallend).vect[0];
  }
  else {
    local_44 = (rhs->smallend).vect[0];
  }
  (this->smallend).vect[0] = local_44;
  if ((rhs->smallend).vect[1] < (this->smallend).vect[1]) {
    local_48 = (this->smallend).vect[1];
  }
  else {
    local_48 = (rhs->smallend).vect[1];
  }
  (this->smallend).vect[1] = local_48;
  if ((rhs->smallend).vect[2] < (this->smallend).vect[2]) {
    local_4c = (this->smallend).vect[2];
  }
  else {
    local_4c = (rhs->smallend).vect[2];
  }
  (this->smallend).vect[2] = local_4c;
  pIVar1 = &this->bigend;
  if (pIVar1->vect[0] < (rhs->bigend).vect[0]) {
    local_5c = pIVar1->vect[0];
  }
  else {
    local_5c = (rhs->bigend).vect[0];
  }
  pIVar1->vect[0] = local_5c;
  if ((this->bigend).vect[1] < (rhs->bigend).vect[1]) {
    local_60 = (this->bigend).vect[1];
  }
  else {
    local_60 = (rhs->bigend).vect[1];
  }
  (this->bigend).vect[1] = local_60;
  if ((this->bigend).vect[2] < (rhs->bigend).vect[2]) {
    local_64 = (this->bigend).vect[2];
  }
  else {
    local_64 = (rhs->bigend).vect[2];
  }
  (this->bigend).vect[2] = local_64;
  return this;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    Box& operator&= (const Box& rhs) noexcept
    {
        BL_ASSERT(sameType(rhs));
        smallend.max(rhs.smallend);
        bigend.min(rhs.bigend);
        return *this;
    }